

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall
CLIntercept::appendBuildOptions(CLIntercept *this,char *append,char *options,char **newOptions)

{
  size_t sVar1;
  char *__dest;
  long *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *newNewOptions;
  char *oldOptions;
  size_t newSize;
  bool modified;
  char *local_48;
  ulong local_30;
  bool local_21;
  
  local_21 = false;
  sVar1 = strlen(in_RSI);
  local_30 = sVar1 + 1;
  local_48 = in_RDX;
  if (*in_RCX != 0) {
    local_48 = (char *)*in_RCX;
  }
  if (local_48 != (char *)0x0) {
    sVar1 = strlen(local_48);
    local_30 = sVar1 + 1 + local_30;
  }
  __dest = (char *)operator_new__(local_30);
  if (__dest != (char *)0x0) {
    memset(__dest,0,local_30);
    if (local_48 != (char *)0x0) {
      strcat(__dest,local_48);
      strcat(__dest," ");
    }
    strcat(__dest,in_RSI);
    if ((void *)*in_RCX != (void *)0x0) {
      operator_delete__((void *)*in_RCX);
    }
    *in_RCX = (long)__dest;
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool CLIntercept::appendBuildOptions(
    const char* append,
    const char* options,
    char*& newOptions ) const
{
    bool    modified = false;

    size_t  newSize = strlen(append) + 1;    // for the null terminator

    const char* oldOptions = newOptions ? newOptions : options;
    if( oldOptions )
    {
        newSize += strlen(oldOptions) + 1;  // for a space
    }

    char* newNewOptions = new char[ newSize ];
    if( newNewOptions )
    {
        memset( newNewOptions, 0, newSize );

        if( oldOptions )
        {
            CLI_STRCAT( newNewOptions, newSize, oldOptions );
            CLI_STRCAT( newNewOptions, newSize, " " );
        }
        CLI_STRCAT( newNewOptions, newSize, append );

        delete [] newOptions;
        newOptions = newNewOptions;

        modified = true;
    }

    return modified;
}